

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::Datum::InternalSwap(Datum *this,Datum *other)

{
  InternalMetadataWithArena *this_00;
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->float_data_,&other->float_data_);
  psVar5 = (this->data_).ptr_;
  (this->data_).ptr_ = (other->data_).ptr_;
  (other->data_).ptr_ = psVar5;
  iVar2 = this->channels_;
  this->channels_ = other->channels_;
  other->channels_ = iVar2;
  iVar2 = this->height_;
  this->height_ = other->height_;
  other->height_ = iVar2;
  iVar2 = this->width_;
  this->width_ = other->width_;
  other->width_ = iVar2;
  iVar2 = this->label_;
  this->label_ = other->label_;
  other->label_ = iVar2;
  bVar1 = this->encoded_;
  this->encoded_ = other->encoded_;
  other->encoded_ = bVar1;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar6 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar9 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar8 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar7 = pUVar8->fields_;
    pUVar8->fields_ = pUVar9->fields_;
    pUVar9->fields_ = pvVar7;
  }
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void Datum::InternalSwap(Datum* other) {
  float_data_.InternalSwap(&other->float_data_);
  data_.Swap(&other->data_);
  std::swap(channels_, other->channels_);
  std::swap(height_, other->height_);
  std::swap(width_, other->width_);
  std::swap(label_, other->label_);
  std::swap(encoded_, other->encoded_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}